

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_push(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  jx9_value *pObj;
  sxi32 sVar1;
  long lVar2;
  jx9_real jVar3;
  bool bVar4;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) {
    jVar3 = 0.0;
  }
  else {
    pMap = (jx9_hashmap *)((*apArg)->x).pOther;
    if (nArg != 1) {
      lVar2 = 0;
      do {
        sVar1 = HashmapInsert(pMap,(jx9_value *)0x0,apArg[lVar2 + 1]);
        if (sVar1 != 0) break;
        bVar4 = (ulong)(uint)nArg - 2 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar4);
    }
    jVar3 = (jx9_real)(ulong)pMap->nEntry;
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  return 0;
}

Assistant:

static int jx9_hashmap_push(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	sxi32 rc;
	int i;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the internal representation of the input hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Start pushing given values */
	for( i = 1 ; i < nArg ; ++i ){
		rc = jx9HashmapInsert(pMap, 0, apArg[i]);
		if( rc != SXRET_OK ){
			break;
		}
	}
	/* Return the new count */
	jx9_result_int64(pCtx, (sxi64)pMap->nEntry);
	return JX9_OK;
}